

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O2

int fits_get_col_minmax(fitsfile *fptr,int colnum,double *datamin,double *datamax,int *status)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long firstrow;
  long nelem;
  double dVar4;
  double nulval;
  long nrows;
  int anynul;
  double array [1000];
  
  ffgky(fptr,0x29,"NAXIS2",&nrows,(char *)0x0,status);
  nulval = -9.1191291391491e-36;
  *datamin = 9e+36;
  *datamax = -9e+36;
  firstrow = 1;
  for (; nrows != 0; nrows = nrows - nelem) {
    nelem = nrows;
    if (99 < nrows) {
      nelem = 100;
    }
    ffgcv(fptr,0x52,colnum,firstrow,1,nelem,&nulval,array,&anynul,status);
    lVar2 = 0;
    if (0 < nelem) {
      lVar2 = nelem;
    }
    for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
      dVar1 = array[lVar3];
      if ((dVar1 != nulval) || (NAN(dVar1) || NAN(nulval))) {
        dVar4 = *datamin;
        if (dVar1 <= *datamin) {
          dVar4 = dVar1;
        }
        *datamin = dVar4;
        dVar4 = *datamax;
        if (*datamax <= dVar1) {
          dVar4 = dVar1;
        }
        *datamax = dVar4;
      }
    }
    firstrow = firstrow + nelem;
  }
  return *status;
}

Assistant:

int fits_get_col_minmax(fitsfile *fptr, int colnum, double *datamin, 
			double *datamax, int *status)
/* 
   Simple utility routine to compute the min and max value in a column
*/
{
    int anynul;
    long nrows, ntodo, firstrow, ii;
    double array[1000], nulval;

    ffgky(fptr, TLONG, "NAXIS2", &nrows, NULL, status); /* no. of rows */

    firstrow = 1;
    nulval = DOUBLENULLVALUE;
    *datamin =  9.0E36;
    *datamax = -9.0E36;

    while(nrows)
    {
        ntodo = minvalue(nrows, 100);
        ffgcv(fptr, TDOUBLE, colnum, firstrow, 1, ntodo, &nulval, array,
              &anynul, status);

        for (ii = 0; ii < ntodo; ii++)
        {
            if (array[ii] != nulval)
            {
                *datamin = minvalue(*datamin, array[ii]);
                *datamax = maxvalue(*datamax, array[ii]);
            }
        }

        nrows -= ntodo;
        firstrow += ntodo;
    }
    return(*status);
}